

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Data.cpp
# Opt level: O3

void __thiscall SRUP_MSG_SYNDICATED_DATA::SRUP_MSG_SYNDICATED_DATA(SRUP_MSG_SYNDICATED_DATA *this)

{
  SRUP_MSG_DATA::SRUP_MSG_DATA(&this->super_SRUP_MSG_DATA);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG._vptr_SRUP_MSG =
       (_func_int **)&PTR__SRUP_MSG_SYNDICATED_DATA_001b2960;
  *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_msgtype = '%';
  this->m_source_ID = (uint64_t *)0x0;
  (this->super_SRUP_MSG_DATA).m_data_ID = (uint8_t *)0x0;
  (this->super_SRUP_MSG_DATA).m_data = (uint8_t *)0x0;
  (this->super_SRUP_MSG_DATA).m_data_len = 0;
  (this->super_SRUP_MSG_DATA).m_data_ID_len = 0;
  return;
}

Assistant:

SRUP_MSG_SYNDICATED_DATA::SRUP_MSG_SYNDICATED_DATA()
{
    m_msgtype[0] = SRUP::SRUP_MESSAGE_TYPE_SYNDICATED_DATA;
    m_data = nullptr;
    m_data_ID = nullptr;
    m_data_ID_len = 0;
    m_data_len = 0;
    m_source_ID = nullptr;
}